

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBox.h
# Opt level: O1

void Imath_3_2::transform<float,float>
               (Box<Imath_3_2::Vec3<float>_> *box,Matrix44<float> *m,
               Box<Imath_3_2::Vec3<float>_> *result)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  float fVar8;
  float fVar9;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined4 uVar10;
  float fVar11;
  float fVar12;
  int i;
  long lVar13;
  float *pfVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float afStack_70 [2];
  Vec3<float> points [8];
  
  points[3].x = (box->min).x;
  points[7].x = (box->max).x;
  if (((points[3].x <= points[7].x) &&
      (fVar24 = (box->min).y, pfVar14 = &(box->max).y, fVar24 < *pfVar14 || fVar24 == *pfVar14)) &&
     (fVar24 = (box->min).z, pfVar14 = &(box->max).z, fVar24 < *pfVar14 || fVar24 == *pfVar14)) {
    fVar1 = (box->min).y;
    fVar8 = (box->min).z;
    if ((((points[7].x != 3.4028235e+38) || (NAN(points[7].x))) ||
        ((points[3].x != -3.4028235e+38 || ((NAN(points[3].x) || (fVar1 != -3.4028235e+38)))))) ||
       ((NAN(fVar1) ||
        (((((fVar24 = (box->max).y, fVar24 != 3.4028235e+38 || (NAN(fVar24))) ||
           (fVar8 != -3.4028235e+38)) ||
          ((NAN(fVar8) || (fVar24 = (box->max).z, fVar24 != 3.4028235e+38)))) || (NAN(fVar24)))))))
    {
      fVar24 = m->x[0][3];
      if ((((fVar24 != 0.0) || (NAN(fVar24))) ||
          ((fVar24 = m->x[1][3], fVar24 != 0.0 ||
           (((NAN(fVar24) || (fVar24 = m->x[2][3], fVar24 != 0.0)) || (NAN(fVar24))))))) ||
         ((fVar24 = m->x[3][3], fVar24 != 1.0 || (NAN(fVar24))))) {
        points[2].x = points[3].x;
        points[1].x = points[3].x;
        points[0].x = points[3].x;
        points[6].x = points[7].x;
        points[5].x = points[7].x;
        points[4].x = points[7].x;
        points[5].y = fVar1;
        points[1].y = fVar1;
        points[6].z = fVar8;
        points[4].y = fVar1;
        points[4].z = fVar8;
        points[2].z = fVar8;
        points[0].y = fVar1;
        points[0].z = fVar8;
        fVar2 = (box->max).y;
        fVar9 = (box->max).z;
        points[6].y = fVar2;
        points[2].y = fVar2;
        points[7].y = fVar2;
        points[7].z = fVar9;
        points[5].z = fVar9;
        points[3].y = fVar2;
        points[3].z = fVar9;
        points[1].z = fVar9;
        lVar13 = 8;
        do {
          fVar24 = *(float *)((long)afStack_70 + lVar13);
          fVar20 = *(float *)((long)afStack_70 + lVar13 + 4);
          fVar25 = *(float *)((long)&points[0].x + lVar13);
          fVar28 = m->x[3][3] + m->x[2][3] * fVar25 + m->x[0][3] * fVar24 + m->x[1][3] * fVar20;
          fVar29 = (result->min).x;
          fVar26 = (result->min).y;
          fVar11 = (result->min).z;
          fVar12 = (result->max).x;
          uVar4 = *(undefined8 *)(m->x[0] + 1);
          uVar5 = *(undefined8 *)(m->x[1] + 1);
          uVar6 = *(undefined8 *)(m->x[2] + 1);
          fVar27 = (m->x[3][0] + m->x[2][0] * fVar25 + m->x[0][0] * fVar24 + m->x[1][0] * fVar20) /
                   fVar28;
          uVar7 = *(undefined8 *)(m->x[3] + 1);
          auVar21._0_4_ =
               (float)uVar7 + (float)uVar6 * fVar25 + (float)uVar4 * fVar24 + (float)uVar5 * fVar20;
          auVar21._4_4_ =
               (float)((ulong)uVar7 >> 0x20) +
               (float)((ulong)uVar6 >> 0x20) * fVar25 +
               (float)((ulong)uVar4 >> 0x20) * fVar24 + (float)((ulong)uVar5 >> 0x20) * fVar20;
          auVar21._8_4_ = fVar25 * 0.0 + fVar24 * 0.0 + fVar20 * 0.0 + 0.0;
          auVar21._12_4_ = fVar25 * 0.0 + fVar24 * 0.0 + fVar20 * 0.0 + 0.0;
          auVar22._4_4_ = fVar28;
          auVar22._0_4_ = fVar28;
          auVar22._8_4_ = fVar28;
          auVar22._12_4_ = fVar28;
          auVar22 = divps(auVar21,auVar22);
          uVar16 = -(uint)(fVar27 < fVar29);
          uVar17 = -(uint)(auVar22._0_4_ < fVar26);
          uVar18 = -(uint)(auVar22._4_4_ < fVar11);
          uVar19 = -(uint)(fVar12 < fVar27);
          (result->min).x = (float)(~uVar16 & (uint)fVar29 | (uint)fVar27 & uVar16);
          (result->min).y = (float)(~uVar17 & (uint)fVar26 | (uint)auVar22._0_4_ & uVar17);
          (result->min).z = (float)(~uVar18 & (uint)fVar11 | (uint)auVar22._4_4_ & uVar18);
          (result->max).x = (float)(~uVar19 & (uint)fVar12 | (uint)fVar27 & uVar19);
          uVar3 = (result->max).y;
          uVar10 = (result->max).z;
          auVar23._4_4_ = uVar10;
          auVar23._0_4_ = uVar3;
          auVar23._8_8_ = 0;
          auVar23 = maxps(auVar22,auVar23);
          (result->max).y = (float)(int)auVar23._0_8_;
          (result->max).z = (float)(int)((ulong)auVar23._0_8_ >> 0x20);
          lVar13 = lVar13 + 0xc;
        } while (lVar13 != 0x68);
      }
      else {
        lVar13 = 0;
        pfVar14 = (float *)m;
        do {
          fVar24 = m->x[3][lVar13];
          (&(result->max).x)[lVar13] = fVar24;
          (&(result->min).x)[lVar13] = fVar24;
          lVar15 = 0;
          fVar20 = fVar24;
          do {
            fVar26 = *(float *)((long)&(box->min).x + lVar15) * pfVar14[lVar15];
            fVar25 = pfVar14[lVar15] * *(float *)((long)&(box->max).x + lVar15);
            fVar29 = fVar26;
            if (fVar25 <= fVar26) {
              fVar29 = fVar25;
            }
            fVar20 = fVar20 + fVar29;
            if (fVar25 <= fVar26) {
              fVar25 = fVar26;
            }
            fVar24 = fVar24 + fVar25;
            (&(result->min).x)[lVar13] = fVar20;
            (&(result->max).x)[lVar13] = fVar24;
            lVar15 = lVar15 + 4;
          } while (lVar15 != 0xc);
          lVar13 = lVar13 + 1;
          pfVar14 = pfVar14 + 1;
        } while (lVar13 != 3);
      }
    }
  }
  return;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline bool
Box<Vec3<T>>::isEmpty () const IMATH_NOEXCEPT
{
    return (max.x < min.x || max.y < min.y || max.z < min.z);
}